

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::add_component_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRVariable *var,
          SPIRType *type,InterfaceBlockMeta *meta)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  size_t sVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  SPIREntryPoint *pSVar11;
  SPIRFunction *pSVar12;
  _func_void *p_Var13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  string *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  CompilerMSL *local_68;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  uint32_t local_40;
  uint32_t uStack_3c;
  uint32_t local_38;
  
  bVar7 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  if (bVar7) {
    uVar9 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    uVar3 = (meta->location_meta)._M_h._M_bucket_count;
    uVar14 = (ulong)uVar9 % uVar3;
    p_Var15 = (meta->location_meta)._M_h._M_buckets[uVar14];
    p_Var16 = (__node_base_ptr)0x0;
    if ((p_Var15 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var15->_M_nxt, p_Var16 = p_Var15,
       uVar9 != *(uint32_t *)&p_Var15->_M_nxt[1]._M_nxt)) {
      while (p_Var15 = p_Var4, p_Var4 = p_Var15->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var16 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar3 != uVar14) ||
           (p_Var16 = p_Var15, uVar9 == *(uint *)&p_Var4[1]._M_nxt)) goto LAB_0028b91b;
      }
      p_Var16 = (__node_base_ptr)0x0;
    }
LAB_0028b91b:
    if (p_Var16 != (__node_base_ptr)0x0) {
      bVar7 = p_Var16->_M_nxt != (_Hash_node_base *)0x0;
      goto LAB_0028b92b;
    }
  }
  else {
    uVar9 = 0xffffffff;
  }
  bVar7 = false;
LAB_0028b92b:
  if (bVar7) {
    bVar8 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    local_80 = ib_var_ref;
    if ((bVar8) && ((this->msl_options).pad_fragment_output_components == true)) {
      pSVar11 = Compiler::get_entry_point((Compiler *)this);
      bVar8 = storage == Output && pSVar11->model == ExecutionModelFragment;
    }
    else {
      bVar8 = false;
    }
    pSVar12 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
    uVar10 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Component);
    uVar1 = type->vecsize;
    if (bVar8) {
      Compiler::get_decoration
                ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    }
    uVar2 = (var->super_IVariant).self.id;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
              (&pSVar12->local_variables,
               (pSVar12->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
    sVar5 = (pSVar12->local_variables).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
    (pSVar12->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
    [sVar5].id = uVar2;
    (pSVar12->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = sVar5 + 1;
    uVar2 = (var->super_IVariant).self.id;
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->vars_needing_early_declaration,
               (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size + 1
              );
    sVar5 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar5] = uVar2;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar5 + 1;
    local_78 = type;
    uStack_70 = var;
    local_68 = this;
    local_40 = uVar9;
    uStack_3c = uVar1;
    local_38 = uVar10;
    if (var->storage == Input) {
      local_60 = local_50;
      pcVar6 = (local_80->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar6,pcVar6 + local_80->_M_string_length);
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      p_Var13 = (_func_void *)operator_new(0x48);
      *(CompilerMSL **)(p_Var13 + 0x10) = local_68;
      *(undefined4 *)p_Var13 = (undefined4)local_78;
      *(undefined4 *)(p_Var13 + 4) = local_78._4_4_;
      *(undefined4 *)(p_Var13 + 8) = (undefined4)uStack_70;
      *(undefined4 *)(p_Var13 + 0xc) = uStack_70._4_4_;
      *(_func_void **)(p_Var13 + 0x18) = p_Var13 + 0x28;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(p_Var13 + 0x18),local_60,local_60 + local_58);
      *(uint32_t *)(p_Var13 + 0x40) = local_38;
      *(ulong *)(p_Var13 + 0x38) = CONCAT44(uStack_3c,local_40);
      pcStack_90 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2503:40)>
                   ::_M_invoke;
      local_98 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2503:40)>
                 ::_M_manager;
      local_a8._M_unused._M_function_pointer = p_Var13;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar12->fixup_hooks_in,(function<void_()> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
    }
    else {
      local_60 = local_50;
      pcVar6 = (local_80->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar6,pcVar6 + local_80->_M_string_length);
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      p_Var13 = (_func_void *)operator_new(0x48);
      *(CompilerMSL **)(p_Var13 + 0x10) = local_68;
      *(undefined4 *)p_Var13 = (undefined4)local_78;
      *(undefined4 *)(p_Var13 + 4) = local_78._4_4_;
      *(undefined4 *)(p_Var13 + 8) = (undefined4)uStack_70;
      *(undefined4 *)(p_Var13 + 0xc) = uStack_70._4_4_;
      *(_func_void **)(p_Var13 + 0x18) = p_Var13 + 0x28;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(p_Var13 + 0x18),local_60,local_60 + local_58);
      *(uint32_t *)(p_Var13 + 0x40) = local_38;
      *(ulong *)(p_Var13 + 0x38) = CONCAT44(uStack_3c,local_40);
      pcStack_90 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2523:41)>
                   ::_M_invoke;
      local_98 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:2523:41)>
                 ::_M_manager;
      local_a8._M_unused._M_function_pointer = p_Var13;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar12->fixup_hooks_out,(function<void_()> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
  }
  return bVar7;
}

Assistant:

bool CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass storage, const std::string &ib_var_ref,
                                                            SPIRVariable &var,
                                                            const SPIRType &type,
                                                            InterfaceBlockMeta &meta)
{
	// Deal with Component decorations.
	const InterfaceBlockMeta::LocationMeta *location_meta = nullptr;
	uint32_t location = ~0u;
	if (has_decoration(var.self, DecorationLocation))
	{
		location = get_decoration(var.self, DecorationLocation);
		auto location_meta_itr = meta.location_meta.find(location);
		if (location_meta_itr != end(meta.location_meta))
			location_meta = &location_meta_itr->second;
	}

	// Check if we need to pad fragment output to match a certain number of components.
	if (location_meta)
	{
		bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
		                           msl_options.pad_fragment_output_components &&
		                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

		auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
		uint32_t start_component = get_decoration(var.self, DecorationComponent);
		uint32_t type_components = type.vecsize;
		uint32_t num_components = location_meta->num_components;

		if (pad_fragment_output)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			num_components = max<uint32_t>(num_components, get_target_components_for_fragment_location(locn));
		}

		// We have already declared an IO block member as m_location_N.
		// Just emit an early-declared variable and fixup as needed.
		// Arrays need to be unrolled here since each location might need a different number of components.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (var.storage == StorageClassInput)
		{
			entry_func.fixup_hooks_in.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(to_name(var.self), "[", loc_off, "]", " = ", ib_var_ref,
						          ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), ";");
					}
				}
				else
				{
					statement(to_name(var.self), " = ", ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), ";");
				}
			});
		}
		else
		{
			entry_func.fixup_hooks_out.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(ib_var_ref, ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), " = ",
						          to_name(var.self), "[", loc_off, "];");
					}
				}
				else
				{
					statement(ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), " = ", to_name(var.self), ";");
				}
			});
		}
		return true;
	}
	else
		return false;
}